

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBegin_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  ZSTD_dictAttachPref_e ZVar1;
  int iVar2;
  ZSTD_strategy ZVar3;
  U32 UVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  void *pvVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  BYTE *pBVar14;
  BYTE *pBVar15;
  ZSTD_compressionParameters cPar;
  U32 UVar16;
  U32 end;
  uint uVar17;
  ZSTD_TraceCtx ZVar18;
  size_t sVar19;
  ulong uVar20;
  size_t sVar21;
  size_t sVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  U32 *pUVar26;
  ZSTD_compressedBlockState_t *bs;
  U32 *pUVar27;
  long lVar28;
  ZSTD_matchState_t *dstMatchState;
  size_t tagTableSize;
  size_t sVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  ZSTD_CCtx_params local_108;
  
  sVar19 = dictSize;
  if (cdict != (ZSTD_CDict *)0x0) {
    sVar19 = cdict->dictContentSize;
  }
  ZVar18 = duckdb_zstd::ZSTD_trace_compress_begin(cctx);
  cctx->traceCtx = ZVar18;
  if (cdict == (ZSTD_CDict *)0x0) {
    sVar21 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar19,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar21) {
      return sVar21;
    }
  }
  else {
    sVar21 = cdict->dictContentSize;
    if (((sVar21 != 0) &&
        ((((pledgedSrcSize < 0x20000 || (pledgedSrcSize == 0xffffffffffffffff)) ||
          (pledgedSrcSize < sVar21 * 6)) || (cdict->compressionLevel == 0)))) &&
       (ZVar1 = params->attachDictPref, ZVar1 != ZSTD_dictForceLoad)) {
      iVar2 = (cdict->matchState).dedicatedDictSearch;
      ZVar3 = (cdict->matchState).cParams.strategy;
      if (iVar2 != 0) {
LAB_003509f0:
        switchD_00332694::default(&local_108,params,0xd8);
        uVar5 = (cdict->matchState).cParams.windowLog;
        uVar8 = (cdict->matchState).cParams.chainLog;
        cPar.chainLog = uVar8;
        cPar.windowLog = uVar5;
        uVar17 = (cdict->matchState).cParams.hashLog;
        uVar25 = 6;
        if (6 < uVar17 - 2) {
          uVar25 = uVar17 - 2;
        }
        if (2 < ZVar3 - ZSTD_greedy) {
          uVar25 = uVar17;
        }
        if (iVar2 == 0) {
          uVar25 = uVar17;
        }
        uVar6 = (cdict->matchState).cParams.searchLog;
        uVar9 = (cdict->matchState).cParams.minMatch;
        uVar17 = local_108.cParams.windowLog;
        cPar.hashLog = uVar25;
        cPar.searchLog = uVar6;
        cPar.minMatch = uVar9;
        cPar.targetLength = (cdict->matchState).cParams.targetLength;
        cPar.strategy = ZVar3;
        ZSTD_adjustCParams_internal
                  (&local_108.cParams,cPar,pledgedSrcSize,sVar21,ZSTD_cpm_attachDict,
                   local_108.useRowMatchFinder);
        local_108.cParams._0_8_ = CONCAT44(local_108.cParams.chainLog,uVar17);
        local_108.useRowMatchFinder = cdict->useRowMatchFinder;
        sVar19 = ZSTD_resetCCtx_internal(cctx,&local_108,pledgedSrcSize,0,ZSTDcrp_makeClean,zbuff);
        if (0xffffffffffffff88 < sVar19) {
          return sVar19;
        }
        uVar20 = (long)(cdict->matchState).window.nextSrc - (long)(cdict->matchState).window.base;
        uVar17 = (uint)uVar20;
        if ((cdict->matchState).window.dictLimit != uVar17) {
          (cctx->blockState).matchState.dictMatchState = &cdict->matchState;
          uVar25 = (cctx->blockState).matchState.window.dictLimit;
          if (uVar25 < uVar17) {
            (cctx->blockState).matchState.window.nextSrc =
                 (cctx->blockState).matchState.window.base + (uVar20 & 0xffffffff);
            (cctx->blockState).matchState.window.lowLimit = uVar17;
            (cctx->blockState).matchState.window.dictLimit = uVar17;
            uVar25 = uVar17;
          }
          (cctx->blockState).matchState.loadedDictEnd = uVar25;
        }
        goto LAB_00350eab;
      }
      if ((pledgedSrcSize == 0xffffffffffffffff) ||
         (pledgedSrcSize <= *(ulong *)(attachDictSizeCutoffs + (ulong)ZVar3 * 8))) {
        if (ZVar1 != ZSTD_dictForceCopy) goto LAB_00350c4b;
      }
      else if (ZVar1 == ZSTD_dictForceAttach) {
LAB_00350c4b:
        if (params->forceWindow == 0) goto LAB_003509f0;
      }
      switchD_00332694::default(&local_108,params,0xd8);
      uVar10 = (cdict->matchState).cParams.chainLog;
      uVar11 = (cdict->matchState).cParams.hashLog;
      uVar12 = (cdict->matchState).cParams.searchLog;
      uVar13 = (cdict->matchState).cParams.minMatch;
      local_108.cParams.targetLength = (cdict->matchState).cParams.targetLength;
      local_108.cParams.strategy = (cdict->matchState).cParams.strategy;
      local_108.cParams.chainLog = uVar10;
      local_108.useRowMatchFinder = cdict->useRowMatchFinder;
      local_108.cParams.hashLog = uVar11;
      local_108.cParams.searchLog = uVar12;
      local_108.cParams.minMatch = uVar13;
      sVar19 = ZSTD_resetCCtx_internal(cctx,&local_108,pledgedSrcSize,0,ZSTDcrp_leaveDirty,zbuff);
      if (0xffffffffffffff88 < sVar19) {
        return sVar19;
      }
      (cctx->workspace).tableValidEnd = (cctx->workspace).objectEnd;
      ZVar3 = (cdict->matchState).cParams.strategy;
      if (ZVar3 == ZSTD_fast) {
        sVar29 = 1L << ((byte)(cdict->matchState).cParams.hashLog & 0x3f);
        pUVar27 = (cctx->blockState).matchState.hashTable;
        pUVar26 = (cdict->matchState).hashTable;
        lVar28 = 0;
LAB_00350d08:
        sVar22 = 0;
        do {
          pUVar27[sVar22] = pUVar26[sVar22] >> 8;
          sVar22 = sVar22 + 1;
        } while (sVar29 != sVar22);
      }
      else {
        uVar17 = ZVar3 - ZSTD_greedy;
        if ((uVar17 < 3) && (cdict->useRowMatchFinder == ZSTD_ps_enable)) {
          bVar24 = (byte)(cdict->matchState).cParams.hashLog;
          sVar29 = 1L << (bVar24 & 0x3f);
          pUVar27 = (cctx->blockState).matchState.hashTable;
          pUVar26 = (cdict->matchState).hashTable;
          lVar28 = 0;
        }
        else {
          lVar28 = 1L << ((byte)(cdict->matchState).cParams.chainLog & 0x3f);
          bVar24 = (byte)(cdict->matchState).cParams.hashLog;
          sVar29 = 1L << (bVar24 & 0x3f);
          pUVar27 = (cctx->blockState).matchState.hashTable;
          pUVar26 = (cdict->matchState).hashTable;
          if (0xfffffffd < uVar17) goto LAB_00350d08;
        }
        switchD_00332694::default(pUVar27,pUVar26,4L << (bVar24 & 0x3f));
      }
      ZVar3 = (cctx->appliedParams).cParams.strategy;
      if ((ZVar3 != ZSTD_fast) &&
         ((2 < ZVar3 - ZSTD_greedy || ((cctx->appliedParams).useRowMatchFinder != ZSTD_ps_enable))))
      {
        pUVar27 = (cctx->blockState).matchState.chainTable;
        pUVar26 = (cdict->matchState).chainTable;
        if ((cdict->matchState).cParams.strategy - ZSTD_greedy < 0xfffffffe) {
          switchD_00332694::default(pUVar27,pUVar26,lVar28 << 2);
        }
        else if (lVar28 != 0) {
          lVar23 = 0;
          do {
            pUVar27[lVar23] = pUVar26[lVar23] >> 8;
            lVar23 = lVar23 + 1;
          } while (lVar28 != lVar23);
        }
      }
      if ((0xfffffffc < (cdict->matchState).cParams.strategy - ZSTD_btlazy2) &&
         (cdict->useRowMatchFinder == ZSTD_ps_enable)) {
        switchD_00332694::default
                  ((cctx->blockState).matchState.tagTable,(cdict->matchState).tagTable,sVar29);
        (cctx->blockState).matchState.hashSalt = (cdict->matchState).hashSalt;
      }
      UVar4 = (cctx->blockState).matchState.hashLog3;
      sVar29 = 0;
      if (UVar4 != 0) {
        sVar29 = 4L << ((byte)UVar4 & 0x3f);
      }
      memset((cctx->blockState).matchState.hashTable3,0,sVar29);
      pvVar7 = (cctx->workspace).tableEnd;
      if ((cctx->workspace).tableValidEnd < pvVar7) {
        (cctx->workspace).tableValidEnd = pvVar7;
      }
      uVar30 = *(undefined4 *)&(cdict->matchState).window.field_0x24;
      (cctx->blockState).matchState.window.nbOverflowCorrections =
           (cdict->matchState).window.nbOverflowCorrections;
      *(undefined4 *)&(cctx->blockState).matchState.window.field_0x24 = uVar30;
      pBVar14 = (cdict->matchState).window.nextSrc;
      pBVar15 = (cdict->matchState).window.base;
      UVar4 = (cdict->matchState).window.dictLimit;
      UVar16 = (cdict->matchState).window.lowLimit;
      (cctx->blockState).matchState.window.dictBase = (cdict->matchState).window.dictBase;
      (cctx->blockState).matchState.window.dictLimit = UVar4;
      (cctx->blockState).matchState.window.lowLimit = UVar16;
      (cctx->blockState).matchState.window.nextSrc = pBVar14;
      (cctx->blockState).matchState.window.base = pBVar15;
      UVar4 = (cdict->matchState).nextToUpdate;
      (cctx->blockState).matchState.loadedDictEnd = (cdict->matchState).loadedDictEnd;
      (cctx->blockState).matchState.nextToUpdate = UVar4;
LAB_00350eab:
      cctx->dictID = cdict->dictID;
      cctx->dictContentSize = cdict->dictContentSize;
      switchD_00332694::default((cctx->blockState).prevCBlock,&cdict->cBlockState,0x1600);
      return 0;
    }
    sVar21 = ZSTD_resetCCtx_internal(cctx,params,pledgedSrcSize,sVar19,ZSTDcrp_makeClean,zbuff);
    if (0xffffffffffffff88 < sVar21) {
      return sVar21;
    }
    if (cdict != (ZSTD_CDict *)0x0) {
      dict = cdict->dictContent;
      dictContentType = cdict->dictContentType;
      bs = (cctx->blockState).prevCBlock;
      uVar30 = SUB84(cctx->entropyWorkspace,0);
      uVar31 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
      dictSize = cdict->dictContentSize;
      goto LAB_00350c07;
    }
  }
  bs = (cctx->blockState).prevCBlock;
  uVar30 = SUB84(cctx->entropyWorkspace,0);
  uVar31 = (undefined4)((ulong)cctx->entropyWorkspace >> 0x20);
LAB_00350c07:
  sVar21 = ZSTD_compress_insertDictionary
                     (bs,&(cctx->blockState).matchState,&cctx->ldmState,&cctx->workspace,
                      &cctx->appliedParams,dict,dictSize,dictContentType,dtlm,ZSTD_tfp_forCCtx,
                      (void *)CONCAT44(uVar31,uVar30));
  if (sVar21 < 0xffffffffffffff89) {
    cctx->dictID = (U32)sVar21;
    cctx->dictContentSize = sVar19;
    return 0;
  }
  return sVar21;
}

Assistant:

static size_t ZSTD_compressBegin_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params, U64 pledgedSrcSize,
                                    ZSTD_buffered_policy_e zbuff)
{
    size_t const dictContentSize = cdict ? cdict->dictContentSize : dictSize;
#if ZSTD_TRACE
    cctx->traceCtx = (ZSTD_trace_compress_begin != NULL) ? ZSTD_trace_compress_begin(cctx) : 0;
#endif
    DEBUGLOG(4, "ZSTD_compressBegin_internal: wlog=%u", params->cParams.windowLog);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if ( (cdict)
      && (cdict->dictContentSize > 0)
      && ( pledgedSrcSize < ZSTD_USE_CDICT_PARAMS_SRCSIZE_CUTOFF
        || pledgedSrcSize < cdict->dictContentSize * ZSTD_USE_CDICT_PARAMS_DICTSIZE_MULTIPLIER
        || pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN
        || cdict->compressionLevel == 0)
      && (params->attachDictPref != ZSTD_dictForceLoad) ) {
        return ZSTD_resetCCtx_usingCDict(cctx, cdict, params, pledgedSrcSize, zbuff);
    }

    FORWARD_IF_ERROR( ZSTD_resetCCtx_internal(cctx, params, pledgedSrcSize,
                                     dictContentSize,
                                     ZSTDcrp_makeClean, zbuff) , "");
    {   size_t const dictID = cdict ?
                ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, cdict->dictContent,
                        cdict->dictContentSize, cdict->dictContentType, dtlm,
                        ZSTD_tfp_forCCtx, cctx->entropyWorkspace)
              : ZSTD_compress_insertDictionary(
                        cctx->blockState.prevCBlock, &cctx->blockState.matchState,
                        &cctx->ldmState, &cctx->workspace, &cctx->appliedParams, dict, dictSize,
                        dictContentType, dtlm, ZSTD_tfp_forCCtx, cctx->entropyWorkspace);
        FORWARD_IF_ERROR(dictID, "ZSTD_compress_insertDictionary failed");
        assert(dictID <= UINT_MAX);
        cctx->dictID = (U32)dictID;
        cctx->dictContentSize = dictContentSize;
    }
    return 0;
}